

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O2

uint gcd(uint a,uint b)

{
  uint uVar1;
  
  while (uVar1 = b, uVar1 != 0) {
    b = a % uVar1;
    a = uVar1;
  }
  return a;
}

Assistant:

unsigned int gcd(unsigned int a, unsigned int b)
{
	/* Use the division-based version of Euclid's algorithm. */
	while (b) {
		unsigned int t = b;

		b = a % b;
		a = t;
	}
	return a;
}